

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentTextureLevelCase::test
          (AttachmentTextureLevelCase *this)

{
  CallLogWrapper *this_00;
  uint in_EAX;
  int mipmapLevel;
  GLenum pname;
  GLenum reference;
  GLuint textureID;
  GLuint framebufferID;
  undefined8 local_28;
  
  local_28 = (ulong)in_EAX;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,(GLuint *)((long)&local_28 + 4));
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,local_28._4_4_);
  pname = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  do {
    local_28 = local_28 & 0xffffffff00000000;
    glu::CallLogWrapper::glGenTextures(this_00,1,(GLuint *)&local_28);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,(GLuint)local_28);
    glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,7,0x8051,0x80,0x80);
    ApiCase::expectError(&this->super_ApiCase,0);
    reference = pname;
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,(GLuint)local_28,pname);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkAttachmentParam
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               0x8ce0,0x8cd2,pname,reference);
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,0,0);
    glu::CallLogWrapper::glDeleteTextures(this_00,1,(GLuint *)&local_28);
    pname = pname + 1;
  } while (pname != 7);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,(GLuint *)((long)&local_28 + 4));
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		for (int mipmapLevel = 0; mipmapLevel < 7; ++mipmapLevel)
		{
			GLuint textureID = 0;
			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D, textureID);
			glTexStorage2D(GL_TEXTURE_2D, 7, GL_RGB8, 128, 128);
			expectError(GL_NO_ERROR);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureID, mipmapLevel);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, mipmapLevel);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}